

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(void)

{
  allocator<char> local_29;
  string local_28;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_28,"/",&local_29);
  ls_path(&local_28);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_28,"c:\\",&local_29);
  ls_path(&local_28);
  std::__cxx11::string::~string((string *)&local_28);
  return 0;
}

Assistant:

int main()
{
  ls_path("/");
  ls_path("c:\\");
}